

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

void __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
::Rips_filtration(Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
                  *this,Sparse_distance_matrix<Params> *_dist,dimension_t _dim_max,
                 value_t _threshold,coefficient_t _modulus)

{
  uint uVar1;
  pointer pvVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  int iVar4;
  
  pvVar2 = (_dist->neighbors).
           super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->dist).neighbors.
  super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (_dist->neighbors).
       super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->dist).neighbors.
  super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
  (this->dist).neighbors.
  super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (_dist->neighbors).
       super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (_dist->neighbors).
  super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (_dist->neighbors).
  super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (_dist->neighbors).
  super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dist).num_edges = _dist->num_edges;
  iVar4 = (int)((ulong)((long)(this->dist).neighbors.
                              super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->dist).neighbors.
                             super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  this->n = iVar4;
  if (iVar4 + -2 < (int)CONCAT71(in_register_00000011,_dim_max)) {
    _dim_max = (dimension_t)(iVar4 + -2);
  }
  this->dim_max = _dim_max;
  this->threshold = _threshold;
  this->modulus = _modulus;
  Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::Cns_encoding
            (&this->simplex_encoding,iVar4,_dim_max + '\x02');
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar3 = this->modulus - 2;
  uVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  iVar4 = (uVar1 ^ 0xffffffe0) + 0x21;
  if (uVar3 == 0) {
    iVar4 = 0;
  }
  this->bits_for_coeff = iVar4;
  return;
}

Assistant:

Rips_filtration(DistanceMatrix&& _dist, dimension_t _dim_max, value_t _threshold, coefficient_t _modulus)
    : dist(std::move(_dist)), n(dist.size()),
    dim_max(std::min<vertex_t>(_dim_max, dist.size() - 2)), threshold(_threshold),
    modulus(_modulus), simplex_encoding(n, dim_max + 2), bits_for_coeff(log2up(modulus-1)) {
      // See entry_with_coeff_t for the logic for log2up(modulus-1) (storing coeff-1)
      if (use_coefficients && simplex_encoding.num_extra_bits() < num_bits_for_coeff())
        // TODO: include relevant numbers in the message
        throw std::overflow_error("Not enough spare bits in the simplex encoding to store a coefficient");
    }